

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::NameApplier::OnReturnCallIndirectExpr
          (NameApplier *this,ReturnCallIndirectExpr *expr)

{
  bool bVar1;
  Result RVar2;
  ReturnCallIndirectExpr *expr_local;
  NameApplier *this_local;
  
  if (((expr->decl).has_func_type & 1U) != 0) {
    RVar2 = UseNameForFuncTypeVar(this,&(expr->decl).type_var);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  RVar2 = UseNameForTableVar(this,&expr->table);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  if (expr->decl.has_func_type) {
    CHECK_RESULT(UseNameForFuncTypeVar(&expr->decl.type_var));
  }
  CHECK_RESULT(UseNameForTableVar(&expr->table));
  return Result::Ok;
}